

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DPolyAction::Serialize(DPolyAction *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DPolyAction *this_local;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"polyobj",&this->m_PolyObj);
  pFVar1 = FSerializer::operator()(pFVar1,"speed",&this->m_Speed);
  pFVar1 = FSerializer::operator()(pFVar1,"dist",&this->m_Dist);
  FSerializer::operator()(pFVar1,"interpolation",&this->m_Interpolation);
  return;
}

Assistant:

void DPolyAction::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("polyobj", m_PolyObj)
		("speed", m_Speed)
		("dist", m_Dist)
		("interpolation", m_Interpolation);
}